

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveString(TidyDocImpl *doc,tmbstr buffer,uint *buflen)

{
  StreamOut *out_00;
  int local_54;
  int status;
  StreamOut *out;
  TidyBuffer outbuf;
  uint nl;
  uint outenc;
  uint *buflen_local;
  tmbstr buffer_local;
  TidyDocImpl *doc_local;
  
  outbuf._28_4_ = SUB84((doc->config).value[0x3c].v,0);
  outbuf.next = (uint)(doc->config).value[0x39].v;
  tidyBufInitWithAllocator((TidyBuffer *)&out,doc->allocator);
  out_00 = prvTidyBufferOutput(doc,(TidyBuffer *)&out,outbuf._28_4_,outbuf.next);
  local_54 = tidyDocSaveStream(doc,out_00);
  if (*buflen < (uint)outbuf.bp) {
    local_54 = -0xc;
  }
  else {
    memcpy(buffer,outbuf.allocator,(ulong)(uint)outbuf.bp);
  }
  *buflen = (uint)outbuf.bp;
  tidyBufFree((TidyBuffer *)&out);
  (*doc->allocator->vtbl->free)(doc->allocator,out_00);
  return local_54;
}

Assistant:

int         tidyDocSaveString( TidyDocImpl* doc, tmbstr buffer, uint* buflen )
{
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    TidyBuffer outbuf;
    StreamOut* out;
    int status;

    tidyBufInitWithAllocator( &outbuf, doc->allocator );
    out = TY_(BufferOutput)( doc, &outbuf, outenc, nl );
    status = tidyDocSaveStream( doc, out );

    if ( outbuf.size > *buflen )
        status = -ENOMEM;
    else
        memcpy( buffer, outbuf.bp, outbuf.size );

    *buflen = outbuf.size;
    tidyBufFree( &outbuf );
    TidyDocFree( doc, out );
    return status;
}